

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeString(ParserImpl *this,string *text)

{
  Tokenizer *this_00;
  TokenType TVar1;
  string_view message;
  string local_a0;
  AlphaNum local_80;
  undefined8 local_50;
  char *local_48;
  
  TVar1 = (this->tokenizer_).current_.type;
  if (TVar1 == TYPE_STRING) {
    this_00 = &this->tokenizer_;
    text->_M_string_length = 0;
    *(text->_M_dataplus)._M_p = '\0';
    if ((this_00->current_).type == TYPE_STRING) {
      do {
        io::Tokenizer::ParseStringAppend(&(this->tokenizer_).current_.text,text);
        io::Tokenizer::Next(this_00);
      } while ((this_00->current_).type == TYPE_STRING);
    }
  }
  else {
    local_50 = 0x16;
    local_48 = "Expected string, got: ";
    local_80.piece_._M_str = (this->tokenizer_).current_.text._M_dataplus._M_p;
    local_80.piece_._M_len = (this->tokenizer_).current_.text._M_string_length;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_a0,(lts_20250127 *)&local_50,&local_80,(AlphaNum *)local_80.piece_._M_len);
    message._M_str = local_a0._M_dataplus._M_p;
    message._M_len = local_a0._M_string_length;
    ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,message);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
  }
  return TVar1 == TYPE_STRING;
}

Assistant:

bool ConsumeString(std::string* text) {
    if (!LookingAtType(io::Tokenizer::TYPE_STRING)) {
      ReportError(
          absl::StrCat("Expected string, got: ", tokenizer_.current().text));
      return false;
    }

    text->clear();
    while (LookingAtType(io::Tokenizer::TYPE_STRING)) {
      io::Tokenizer::ParseStringAppend(tokenizer_.current().text, text);

      tokenizer_.Next();
    }

    return true;
  }